

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv.cc
# Opt level: O3

CalculatedFloat __thiscall
absl::anon_unknown_0::CalculateFromParsedHexadecimal<float>
          (anon_unknown_0 *this,ParsedFloat *parsed_hex)

{
  long lVar1;
  uint uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint uVar5;
  ulong uVar6;
  Nonnull<bool_*> in_R9;
  bool bVar7;
  CalculatedFloat CVar8;
  bool result_exact;
  
  if (this == (anon_unknown_0 *)0x0) {
    uVar2 = 0x40;
  }
  else {
    lVar1 = 0x3f;
    if (this != (anon_unknown_0 *)0x0) {
      for (; (ulong)this >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    uVar2 = (uint)lVar1 ^ 0x3f;
  }
  uVar5 = -(int)parsed_hex - 0x95;
  if ((int)uVar5 < (int)(0x28 - uVar2)) {
    uVar5 = 0x28 - uVar2;
  }
  uVar4 = 0;
  uVar3 = ShiftRightAndRound(this,(uint128)(ZEXT416(uVar5) << 0x40),1,true,in_R9);
  bVar7 = uVar3 == 0x1000000;
  if (bVar7) {
    uVar3 = 0x800000;
  }
  uVar5 = (uint)bVar7 + (int)parsed_hex + uVar5;
  uVar2 = 0xfffe7961;
  if (uVar3 != 0) {
    uVar2 = uVar5;
  }
  uVar6 = 99999;
  if ((int)uVar5 < 0x69) {
    uVar6 = (ulong)uVar2;
    uVar4 = uVar3;
  }
  CVar8._8_8_ = uVar6;
  CVar8.mantissa = uVar4;
  return CVar8;
}

Assistant:

CalculatedFloat CalculateFromParsedHexadecimal(
    const strings_internal::ParsedFloat& parsed_hex) {
  uint64_t mantissa = parsed_hex.mantissa;
  int exponent = parsed_hex.exponent;
  // This static_cast is only needed when using a std::bit_width()
  // implementation that does not have the fix for LWG 3656 applied.
  int mantissa_width = static_cast<int>(bit_width(mantissa));
  const int shift = NormalizedShiftSize<FloatType>(mantissa_width, exponent);
  bool result_exact;
  exponent += shift;
  mantissa = ShiftRightAndRound(mantissa, shift,
                                /* input exact= */ true, &result_exact);
  // ParseFloat handles rounding in the hexadecimal case, so we don't have to
  // check `result_exact` here.
  return CalculatedFloatFromRawValues<FloatType>(mantissa, exponent);
}